

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_right_value_reference.cpp
# Opt level: O3

void use_right_value_reference(void)

{
  ostream *poVar1;
  double v;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"v value and address: ",0x15);
  poVar1 = std::ostream::_M_insert<double>(3.5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"v1 value and address: ",0x16);
  poVar1 = std::ostream::_M_insert<double>(7.11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"v2 value and address: ",0x16);
  poVar1 = std::ostream::_M_insert<double>(-23.25);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"v3 value and address: ",0x16);
  poVar1 = std::ostream::_M_insert<double>(-30.694444444444443);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void use_right_value_reference() {
    using namespace std;

    double v = 3.5;

    //  right value reference: a reference holding a right value
    //  what's the difference?
    double && v1 = 7.11;
    double && v2 = v * 2.5 - 32;
    double && v3 = f(v2);

    //  seems no difference...
    cout << "v value and address: " << v << ", " << & v << endl;
    cout << "v1 value and address: " << v1 << ", " << & v1 << endl;
    cout << "v2 value and address: " << v2 << ", " << & v2 << endl;
    cout << "v3 value and address: " << v3 << ", " << & v3 << endl;
}